

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeSearchPointPop(RtreeCursor *p)

{
  byte bVar1;
  RtreeSearchPoint *pRVar2;
  u8 uVar3;
  u8 uVar4;
  undefined5 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  RtreeSearchPoint *pRVar10;
  int n;
  int k;
  int j;
  int i;
  RtreeCursor *p_local;
  
  iVar6 = 1 - (uint)p->bPoint;
  if (p->aNode[iVar6] != (RtreeNode *)0x0) {
    nodeRelease((Rtree *)(p->base).pVtab,p->aNode[iVar6]);
    p->aNode[iVar6] = (RtreeNode *)0x0;
  }
  if (p->bPoint == '\0') {
    if (p->nPoint != 0) {
      bVar1 = p->aPoint->iLevel;
      p->anQueue[bVar1] = p->anQueue[bVar1] - 1;
      iVar6 = p->nPoint;
      iVar7 = iVar6 + -1;
      p->nPoint = iVar7;
      pRVar2 = p->aPoint;
      pRVar10 = p->aPoint + iVar7;
      pRVar2->rScore = pRVar10->rScore;
      pRVar2->id = pRVar10->id;
      uVar3 = pRVar10->eWithin;
      uVar4 = pRVar10->iCell;
      uVar5 = *(undefined5 *)&pRVar10->field_0x13;
      pRVar2->iLevel = pRVar10->iLevel;
      pRVar2->eWithin = uVar3;
      pRVar2->iCell = uVar4;
      *(undefined5 *)&pRVar2->field_0x13 = uVar5;
      if (iVar7 < 4) {
        p->aNode[1] = p->aNode[iVar6];
        p->aNode[iVar6] = (RtreeNode *)0x0;
      }
      k = 0;
      while( true ) {
        iVar6 = k * 2 + 1;
        if (iVar7 <= iVar6) break;
        iVar8 = k * 2 + 2;
        if ((iVar8 < iVar7) &&
           (iVar9 = rtreeSearchPointCompare(p->aPoint + iVar8,p->aPoint + iVar6), iVar9 < 0)) {
          iVar6 = rtreeSearchPointCompare(p->aPoint + iVar8,p->aPoint + k);
          if (-1 < iVar6) {
            return;
          }
          rtreeSearchPointSwap(p,k,iVar8);
          k = iVar8;
        }
        else {
          iVar8 = rtreeSearchPointCompare(p->aPoint + iVar6,p->aPoint + k);
          if (-1 < iVar8) {
            return;
          }
          rtreeSearchPointSwap(p,k,iVar6);
          k = iVar6;
        }
      }
    }
  }
  else {
    bVar1 = (p->sPoint).iLevel;
    p->anQueue[bVar1] = p->anQueue[bVar1] - 1;
    p->bPoint = '\0';
  }
  return;
}

Assistant:

static void rtreeSearchPointPop(RtreeCursor *p){
  int i, j, k, n;
  i = 1 - p->bPoint;
  assert( i==0 || i==1 );
  if( p->aNode[i] ){
    nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
    p->aNode[i] = 0;
  }
  if( p->bPoint ){
    p->anQueue[p->sPoint.iLevel]--;
    p->bPoint = 0;
  }else if( p->nPoint ){
    p->anQueue[p->aPoint[0].iLevel]--;
    n = --p->nPoint;
    p->aPoint[0] = p->aPoint[n];
    if( n<RTREE_CACHE_SZ-1 ){
      p->aNode[1] = p->aNode[n+1];
      p->aNode[n+1] = 0;
    }
    i = 0;
    while( (j = i*2+1)<n ){
      k = j+1;
      if( k<n && rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[j])<0 ){
        if( rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, k);
          i = k;
        }else{
          break;
        }
      }else{
        if( rtreeSearchPointCompare(&p->aPoint[j], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, j);
          i = j;
        }else{
          break;
        }
      }
    }
  }
}